

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O2

void __thiscall
vkt::Draw::RenderPassCreateInfo::addDependency
          (RenderPassCreateInfo *this,VkSubpassDependency dependency)

{
  pointer pVVar1;
  allocator_type local_39;
  VkSubpassDependency local_38;
  
  local_38.srcSubpass = dependency.srcSubpass;
  local_38.dstSubpass = dependency.dstSubpass;
  local_38.srcStageMask = dependency.srcStageMask;
  local_38.dstStageMask = dependency.dstStageMask;
  local_38.srcAccessMask = dependency.srcAccessMask;
  local_38.dstAccessMask = dependency.dstAccessMask;
  local_38.dependencyFlags = dependency.dependencyFlags;
  std::vector<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>::
  emplace_back<vkt::Draw::SubpassDependency>(&this->m_dependiences,(SubpassDependency *)&local_38);
  std::vector<vk::VkSubpassDependency,std::allocator<vk::VkSubpassDependency>>::
  vector<__gnu_cxx::__normal_iterator<vkt::Draw::SubpassDependency*,std::vector<vkt::Draw::SubpassDependency,std::allocator<vkt::Draw::SubpassDependency>>>,void>
            ((vector<vk::VkSubpassDependency,std::allocator<vk::VkSubpassDependency>> *)&local_38,
             (this->m_dependiences).
             super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->m_dependiences).
             super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
             ._M_impl.super__Vector_impl_data._M_finish,&local_39);
  std::vector<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>::_M_move_assign
            (&this->m_dependiencesStructs,&local_38);
  std::_Vector_base<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>::
  ~_Vector_base((_Vector_base<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_> *)
                &local_38);
  pVVar1 = (this->m_dependiencesStructs).
           super__Vector_base<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->super_VkRenderPassCreateInfo).dependencyCount =
       (deUint32)
       (((long)(this->m_dependiences).
               super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->m_dependiences).
              super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x1c);
  (this->super_VkRenderPassCreateInfo).pDependencies = pVVar1;
  return;
}

Assistant:

void
RenderPassCreateInfo::addDependency (vk::VkSubpassDependency dependency)
{

	m_dependiences.push_back(dependency);
	m_dependiencesStructs	= std::vector<vk::VkSubpassDependency>(m_dependiences.begin(), m_dependiences.end());

	dependencyCount			= static_cast<deUint32>(m_dependiences.size());
	pDependencies			= &m_dependiencesStructs[0];
}